

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ON_Texture * ON_Texture::Cast(ON_Object *p)

{
  bool bVar1;
  ON_Texture *pOVar2;
  
  if (p != (ON_Object *)0x0) {
    bVar1 = ON_Object::IsKindOf(p,&m_ON_Texture_class_rtti);
    pOVar2 = (ON_Texture *)0x0;
    if (bVar1) {
      pOVar2 = (ON_Texture *)p;
    }
    return pOVar2;
  }
  return (ON_Texture *)0x0;
}

Assistant:

bool ON_Texture::IsValid( ON_TextLog* text_log ) const
{
  if ( ON_Texture::TYPE::no_texture_type == m_type )
  {
    if ( text_log )
    {
      text_log->Print("ON_Texture m_type has invalid value.\n");
    }
    return false;
  }

  // TODO ...

  return true;
}